

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

Vec_Ptr_t * findDisjunctiveMonotoneSignals(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  aigPoIndices *aigPoIndicesArg;
  antecedentConsequentVectorsStruct *anteConseVectors;
  Aig_Man_t *pAig;
  Vec_Ptr_t *candVec;
  Vec_Int_t *Entry;
  Vec_Ptr_t *masterVec;
  Vec_Ptr_t *candVec_00;
  
  iVar1 = findPendingSignal(pNtk);
  if (iVar1 == -1) {
    puts("\nNo Pending Signal Found");
  }
  else {
    pVVar4 = findHintOutputs(pNtk);
    if (pVVar4 != (Vec_Int_t *)0x0) {
      iVar2 = Vec_IntEntry(pVVar4,0);
      iVar3 = Vec_IntEntry(pVVar4,pVVar4->nSize + -1);
      aigPoIndicesArg = allocAigPoIndices();
      aigPoIndicesArg->attrPendingSignalIndex = iVar1;
      aigPoIndicesArg->attrHintSingalBeginningMarker = iVar2;
      aigPoIndicesArg->attrHintSingalEndMarker = iVar3;
      iVar1 = collectSafetyInvariantPOIndex(pNtk);
      aigPoIndicesArg->attrSafetyInvarIndex = iVar1;
      anteConseVectors = allocAntecedentConsequentVectorsStruct();
      anteConseVectors->attrAntecedents = (Vec_Int_t *)0x0;
      anteConseVectors->attrConsequentCandidates = pVVar4;
      if (pNtk->ntkType != ABC_NTK_STRASH) {
        pNtk = Abc_NtkStrash(pNtk,0,0,0);
      }
      pAig = Abc_NtkToDar(pNtk,0,1);
      pVVar4 = findNewDisjunctiveMonotone(pAig,aigPoIndicesArg,anteConseVectors);
      candVec = Vec_PtrAlloc(0);
      iVar1 = pVVar4->nSize;
      for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(pVVar4,iVar2);
        Entry = createSingletonIntVector(iVar3);
        Vec_PtrPush(candVec,Entry);
      }
      masterVec = Vec_PtrAlloc(candVec->nSize);
      appendVecToMasterVecInt(masterVec,candVec);
      candVec_00 = findNextLevelDisjunctiveMonotone(pAig,aigPoIndicesArg,anteConseVectors,candVec);
      appendVecToMasterVecInt(masterVec,candVec_00);
      deallocAigPoIndices(aigPoIndicesArg);
      deallocAntecedentConsequentVectorsStruct(anteConseVectors);
      deallocateVecOfIntVec(candVec);
      deallocateVecOfIntVec(candVec_00);
      Aig_ManStop(pAig);
      Vec_IntFree(pVVar4);
      return masterVec;
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *findDisjunctiveMonotoneSignals( Abc_Ntk_t *pNtk )
{
	Aig_Man_t *pAig;
	Vec_Int_t *vCandidateMonotoneSignals;
	Vec_Int_t *vKnownMonotoneSignals;
	//Vec_Int_t *vKnownMonotoneSignalsRoundTwo;
	//Vec_Int_t *vOldConsequentVector;
	//Vec_Int_t *vRemainingConsecVector;
	int i;
	int iElem;
	int pendingSignalIndex;
	Abc_Ntk_t *pNtkTemp;
	int hintSingalBeginningMarker;
	int hintSingalEndMarker;
	struct aigPoIndices *aigPoIndicesInstance;
	//struct monotoneVectorsStruct *monotoneVectorsInstance;
	struct antecedentConsequentVectorsStruct *anteConsecInstance;
	//Aig_Obj_t *safetyDriverNew;
	Vec_Int_t *newIntVec;
	Vec_Ptr_t *levelOneMonotne, *levelTwoMonotne;
	//Vec_Ptr_t *levelThreeMonotne;

	Vec_Ptr_t *vMasterDisjunctions;

	extern int findPendingSignal(Abc_Ntk_t *pNtk);
	extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);	
	extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );

	//system("rm monotone.dat");
	
	/*******************************************/	
	//Finding the PO index of the pending signal 
	/*******************************************/	
	pendingSignalIndex = findPendingSignal(pNtk);
	if( pendingSignalIndex == -1 )
	{
		printf("\nNo Pending Signal Found\n");
		return NULL;
	}
	//else
		//printf("Po[%d] = %s\n", pendingSignalIndex, Abc_ObjName( Abc_NtkPo(pNtk, pendingSignalIndex) ) );

	/*******************************************/	
	//Finding the PO indices of all hint signals
	/*******************************************/	
	vCandidateMonotoneSignals = findHintOutputs(pNtk);
	if( vCandidateMonotoneSignals == NULL )
		return NULL;
	else
	{
		//Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
		//	printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
		hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
		hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
	}

	/**********************************************/
	//Allocating "struct" with necessary parameters
	/**********************************************/
	aigPoIndicesInstance = allocAigPoIndices();
	aigPoIndicesInstance->attrPendingSignalIndex = pendingSignalIndex;
	aigPoIndicesInstance->attrHintSingalBeginningMarker = hintSingalBeginningMarker;
	aigPoIndicesInstance->attrHintSingalEndMarker = hintSingalEndMarker;
	aigPoIndicesInstance->attrSafetyInvarIndex = collectSafetyInvariantPOIndex(pNtk);

	/****************************************************/
	//Allocating "struct" with necessary monotone vectors
	/****************************************************/
	anteConsecInstance = allocAntecedentConsequentVectorsStruct();
	anteConsecInstance->attrAntecedents = NULL;
	anteConsecInstance->attrConsequentCandidates = vCandidateMonotoneSignals;

	/*******************************************/	
	//Generate AIG from Ntk
	/*******************************************/	
	if( !Abc_NtkIsStrash( pNtk ) )
	{
		pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
		pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
	}
	else
	{
		pAig = Abc_NtkToDar( pNtk, 0, 1 );
		pNtkTemp = pNtk;
	}

	/*******************************************/	
	//finding LEVEL 1 monotone signals
	/*******************************************/	
	//printf("Calling target function outside loop\n");
	vKnownMonotoneSignals = findNewDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance );
	levelOneMonotne = Vec_PtrAlloc(0);
	Vec_IntForEachEntry( vKnownMonotoneSignals, iElem, i )
	{
		newIntVec = createSingletonIntVector( iElem );
		Vec_PtrPush( levelOneMonotne, newIntVec );
		//printf("Monotone Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
	}
	//printAllIntVectors( levelOneMonotne, pNtk, "monotone.dat" );

	vMasterDisjunctions = Vec_PtrAlloc( Vec_PtrSize( levelOneMonotne ));
	appendVecToMasterVecInt(vMasterDisjunctions, levelOneMonotne );

	/*******************************************/	
	//finding LEVEL >1 monotone signals
	/*******************************************/	
	#if 0
	if( vKnownMonotoneSignals )
	{
		Vec_IntForEachEntry( vKnownMonotoneSignals, iElem, i )
		{
			printf("\n**************************************************************\n");
			printf("Exploring Second Layer : Reference Po[%d] = %s", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ));
			printf("\n**************************************************************\n");
			anteConsecInstance->attrAntecedents = createSingletonIntVector( iElem );
			vOldConsequentVector = anteConsecInstance->attrConsequentCandidates;
			vRemainingConsecVector = updateAnteConseVectors(anteConsecInstance);
			if( anteConsecInstance->attrConsequentCandidates != vRemainingConsecVector )
			{
				anteConsecInstance->attrConsequentCandidates = vRemainingConsecVector;
			}
			vKnownMonotoneSignalsRoundTwo = findNewDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance );
			Vec_IntForEachEntry( vKnownMonotoneSignalsRoundTwo, iElemTwo, iTwo )
			{
				printf("Monotone Po[%d] = %s, (%d, %d)\n", iElemTwo, Abc_ObjName( Abc_NtkPo(pNtk, iElemTwo) ), iElem, iElemTwo );
			}
			Vec_IntFree(vKnownMonotoneSignalsRoundTwo);
			Vec_IntFree(anteConsecInstance->attrAntecedents);
			if(anteConsecInstance->attrConsequentCandidates != vOldConsequentVector)
			{
				Vec_IntFree(anteConsecInstance->attrConsequentCandidates);
				anteConsecInstance->attrConsequentCandidates = vOldConsequentVector;
			}
		}
	}
	#endif 

#if 1
	levelTwoMonotne = findNextLevelDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance, levelOneMonotne );
	//printAllIntVectors( levelTwoMonotne, pNtk, "monotone.dat" );
	appendVecToMasterVecInt(vMasterDisjunctions, levelTwoMonotne );
#endif

	//levelThreeMonotne = findNextLevelDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstance, levelTwoMonotne );
	//printAllIntVectors( levelThreeMonotne );
	//printAllIntVectors( levelTwoMonotne, pNtk, "monotone.dat" );
	//appendVecToMasterVecInt(vMasterDisjunctions, levelThreeMonotne );

	deallocAigPoIndices(aigPoIndicesInstance);
	deallocAntecedentConsequentVectorsStruct(anteConsecInstance);
	//deallocPointersToMonotoneVectors(monotoneVectorsInstance);

	deallocateVecOfIntVec( levelOneMonotne );
	deallocateVecOfIntVec( levelTwoMonotne );

	Aig_ManStop(pAig);
	Vec_IntFree(vKnownMonotoneSignals);

	return vMasterDisjunctions;
}